

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

bool __thiscall BanMan::IsBanned(BanMan *this,CSubNet *sub_net)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::mutex> *mutexIn;
  reference ppVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  long in_FS_OFFSET;
  int64_t current_time;
  CBanEntry ban_entry;
  iterator i;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  key_type *in_stack_ffffffffffffff68;
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = (AnnotatedMixin<std::mutex> *)GetTime();
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RSI,mutexIn,in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::find(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::end(in_stack_ffffffffffffff70);
  bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          (_Self *)in_stack_ffffffffffffff70);
  if ((((bVar2 ^ 0xffU) & 1) == 0) ||
     (ppVar3 = std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
                          in_stack_ffffffffffffff68), (ppVar3->second).nBanUntil <= (long)mutexIn))
  {
    local_41 = false;
  }
  else {
    local_41 = true;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool BanMan::IsBanned(const CSubNet& sub_net)
{
    auto current_time = GetTime();
    LOCK(m_banned_mutex);
    banmap_t::iterator i = m_banned.find(sub_net);
    if (i != m_banned.end()) {
        CBanEntry ban_entry = (*i).second;
        if (current_time < ban_entry.nBanUntil) {
            return true;
        }
    }
    return false;
}